

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heter_queue_examples.cpp
# Opt level: O2

void density_tests::heterogeneous_queue_reentrant_put_transaction_samples(void)

{
  void *i_data;
  bool bVar1;
  int *piVar2;
  Msg *pMVar3;
  ostream *poVar4;
  difference_type dVar5;
  runtime_type<> *prVar6;
  type_info *ptVar7;
  double *pdVar8;
  size_t i_len;
  size_t i_len_00;
  reentrant_put_transaction<void> transaction;
  type transaction2;
  heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> queue;
  heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> queue_1;
  int msg_2;
  int value_2;
  reentrant_put_transaction<void> local_f8;
  reentrant_put_transaction<int> local_e0;
  reentrant_put_transaction<int> local_c8;
  heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> local_b0;
  double local_a0;
  int local_94;
  reentrant_put_transaction<int> local_90;
  const_iterator local_78;
  const_iterator local_50;
  
  local_f8.m_queue =
       (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)0x0;
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  reentrant_put_transaction<void>::~reentrant_put_transaction(&local_f8);
  local_c8.m_queue =
       (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)0xffef;
  local_c8.m_put_data.m_control_block = (ControlBlock *)0xffef;
  local_b0.m_head = (ControlBlock *)CONCAT44(local_b0.m_head._4_4_,1);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  start_reentrant_push<int>
            (&local_e0,
             (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
             &local_c8,(int *)&local_b0);
  local_f8.m_queue = local_e0.m_queue;
  local_f8.m_put_data.m_control_block = local_e0.m_put_data.m_control_block;
  local_f8.m_put_data.m_user_storage = local_e0.m_put_data.m_user_storage;
  local_e0.m_queue =
       (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)0x0;
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  reentrant_put_transaction<int>::~reentrant_put_transaction(&local_e0);
  local_e0.m_queue = local_f8.m_queue;
  local_e0.m_put_data.m_control_block = local_f8.m_put_data.m_control_block;
  local_e0.m_put_data.m_user_storage = local_f8.m_put_data.m_user_storage;
  local_f8.m_queue =
       (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)0x0;
  piVar2 = (int *)density::
                  heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
                  reentrant_put_transaction<int>::element_ptr(&local_e0);
  if (*piVar2 != 1) {
    __assert_fail("transaction2.element() == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                  ,0x341,
                  "void density_tests::heterogeneous_queue_reentrant_put_transaction_samples()");
  }
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  reentrant_put_transaction<int>::commit(&local_e0);
  if ((reentrant_put_transaction<void> *)local_e0.m_queue != (reentrant_put_transaction<void> *)0x0)
  {
    __assert_fail("transaction2.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                  ,0x345,
                  "void density_tests::heterogeneous_queue_reentrant_put_transaction_samples()");
  }
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  reentrant_put_transaction<int>::~reentrant_put_transaction(&local_e0);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  reentrant_put_transaction<int>::~reentrant_put_transaction
            ((reentrant_put_transaction<int> *)&local_f8);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::destroy
            ((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
             &local_c8);
  local_b0.m_head = (ControlBlock *)0xffef;
  local_b0.m_tail = (ControlBlock *)0xffef;
  local_c8.m_queue =
       (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
       CONCAT44(local_c8.m_queue._4_4_,1);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  start_reentrant_push<int>(&local_e0,&local_b0,(int *)&local_c8);
  local_f8.m_queue = local_e0.m_queue;
  local_f8.m_put_data.m_control_block = local_e0.m_put_data.m_control_block;
  local_f8.m_put_data.m_user_storage = local_e0.m_put_data.m_user_storage;
  local_e0.m_queue =
       (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)0x0;
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  reentrant_put_transaction<int>::~reentrant_put_transaction(&local_e0);
  local_e0.m_queue =
       (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)0x0;
  local_a0._0_4_ = 1;
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  start_reentrant_push<int>(&local_c8,&local_b0,(int *)&local_a0);
  density::heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::
  reentrant_put_transaction<void>::operator=((reentrant_put_transaction<void> *)&local_e0,&local_c8)
  ;
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  reentrant_put_transaction<int>::~reentrant_put_transaction(&local_c8);
  density::heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::
  reentrant_put_transaction<void>::operator=
            ((reentrant_put_transaction<void> *)&local_e0,
             (reentrant_put_transaction<int> *)&local_f8);
  if ((reentrant_put_transaction<void> *)local_f8.m_queue != (reentrant_put_transaction<void> *)0x0)
  {
    __assert_fail("transaction1.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                  ,0x370,
                  "void density_tests::heterogeneous_queue_reentrant_put_transaction_samples()");
  }
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  reentrant_put_transaction<void>::commit((reentrant_put_transaction<void> *)&local_e0);
  if (local_e0.m_queue !=
      (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)0x0) {
    __assert_fail("transaction2.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                  ,0x372,
                  "void density_tests::heterogeneous_queue_reentrant_put_transaction_samples()");
  }
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  reentrant_put_transaction<void>::~reentrant_put_transaction
            ((reentrant_put_transaction<void> *)&local_e0);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  reentrant_put_transaction<int>::~reentrant_put_transaction
            ((reentrant_put_transaction<int> *)&local_f8);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::destroy
            (&local_b0);
  local_e0.m_queue =
       (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)0xffef;
  local_e0.m_put_data.m_control_block = (ControlBlock *)0xffef;
  local_c8.m_queue =
       (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)&local_e0
  ;
  std::chrono::_V2::system_clock::now();
  local_b0.m_head = (ControlBlock *)CONCAT44(local_b0.m_head._4_4_,0x2a);
  local_a0 = (double)CONCAT44(local_a0._4_4_,0x237);
  heterogeneous_queue_reentrant_put_transaction_samples::anon_class_8_1_a8890831::operator()
            ((anon_class_8_1_a8890831 *)&local_c8,&local_b0,i_len);
  heterogeneous_queue_reentrant_put_transaction_samples::anon_class_8_1_a8890831::operator()
            ((anon_class_8_1_a8890831 *)&local_c8,&local_a0,i_len_00);
  while( true ) {
    local_f8.m_put_data.m_control_block =
         density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
         start_consume_impl((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                             *)&local_e0);
    local_f8.m_queue =
         (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
         &local_e0;
    if (local_f8.m_put_data.m_control_block == (ControlBlock *)0x0) break;
    pMVar3 = density::heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>
             ::reentrant_consume_operation::
             element<density_tests::heterogeneous_queue_reentrant_put_transaction_samples()::Msg>
                       ((reentrant_consume_operation *)&local_f8);
    i_data = pMVar3->m_data;
    pMVar3 = density::heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>
             ::reentrant_consume_operation::
             element<density_tests::heterogeneous_queue_reentrant_put_transaction_samples()::Msg>
                       ((reentrant_consume_operation *)&local_f8);
    compute_checksum(i_data,pMVar3->m_len);
    poVar4 = std::operator<<((ostream *)&std::cout,"Message with checksum ");
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    std::operator<<(poVar4," at ");
    density::heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::
    reentrant_consume_operation::
    element<density_tests::heterogeneous_queue_reentrant_put_transaction_samples()::Msg>
              ((reentrant_consume_operation *)&local_f8);
    poVar4 = std::ostream::_M_insert<long>((long)&std::cout);
    std::endl<char,std::char_traits<char>>(poVar4);
    density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
    reentrant_consume_operation::commit((reentrant_consume_operation *)&local_f8);
    density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
    reentrant_consume_operation::~reentrant_consume_operation
              ((reentrant_consume_operation *)&local_f8);
  }
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  reentrant_consume_operation::~reentrant_consume_operation
            ((reentrant_consume_operation *)&local_f8);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::destroy
            ((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
             &local_e0);
  local_f8.m_queue =
       (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)0xffef;
  local_f8.m_put_data.m_control_block = (ControlBlock *)0xffef;
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::destroy
            ((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
             &local_f8);
  local_f8.m_queue =
       (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)0xffef;
  local_f8.m_put_data.m_control_block = (ControlBlock *)0xffef;
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::destroy
            ((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
             &local_f8);
  local_f8.m_queue =
       (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)0x0;
  local_c8.m_queue =
       (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)0xffef;
  local_c8.m_put_data.m_control_block = (ControlBlock *)0xffef;
  local_b0.m_head._0_4_ = 1;
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  start_reentrant_push<int>
            (&local_e0,
             (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
             &local_c8,(int *)&local_b0);
  density::heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::
  reentrant_put_transaction<void>::operator=((reentrant_put_transaction<void> *)&local_f8,&local_e0)
  ;
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  reentrant_put_transaction<int>::~reentrant_put_transaction(&local_e0);
  if (local_f8.m_queue ==
      (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)0x0) {
    __assert_fail("!transaction.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                  ,0x3e9,
                  "void density_tests::heterogeneous_queue_reentrant_put_transaction_samples()");
  }
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  reentrant_put_transaction<void>::~reentrant_put_transaction(&local_f8);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::destroy
            ((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
             &local_c8);
  local_f8.m_queue =
       (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)0x0;
  local_c8.m_queue =
       (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)0xffef;
  local_c8.m_put_data.m_control_block = (ControlBlock *)0xffef;
  local_b0.m_head._0_4_ = 1;
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  start_reentrant_push<int>
            (&local_e0,
             (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
             &local_c8,(int *)&local_b0);
  density::heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::
  reentrant_put_transaction<void>::operator=((reentrant_put_transaction<void> *)&local_f8,&local_e0)
  ;
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  reentrant_put_transaction<int>::~reentrant_put_transaction(&local_e0);
  if (local_f8.m_queue ==
      (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)0x0) {
    __assert_fail("transaction",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                  ,0x3f3,
                  "void density_tests::heterogeneous_queue_reentrant_put_transaction_samples()");
  }
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  reentrant_put_transaction<void>::~reentrant_put_transaction(&local_f8);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::destroy
            ((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
             &local_c8);
  local_f8.m_queue =
       (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)0x0;
  local_c8.m_queue =
       (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)0xffef;
  local_c8.m_put_data.m_control_block = (ControlBlock *)0xffef;
  local_b0.m_head._0_4_ = 1;
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  start_reentrant_push<int>
            (&local_e0,
             (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
             &local_c8,(int *)&local_b0);
  density::heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::
  reentrant_put_transaction<void>::operator=((reentrant_put_transaction<void> *)&local_f8,&local_e0)
  ;
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  reentrant_put_transaction<int>::~reentrant_put_transaction(&local_e0);
  if ((reentrant_put_transaction<int> *)local_f8.m_queue != &local_c8) {
    __assert_fail("transaction.queue() == &queue",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                  ,0x3fd,
                  "void density_tests::heterogeneous_queue_reentrant_put_transaction_samples()");
  }
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  reentrant_put_transaction<void>::~reentrant_put_transaction(&local_f8);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::destroy
            ((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
             &local_c8);
  local_c8.m_queue =
       (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)0xffef;
  local_c8.m_put_data.m_control_block = (ControlBlock *)0xffef;
  bVar1 = density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
          ::empty((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                   *)&local_c8);
  if (!bVar1) {
    __assert_fail("queue.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                  ,0x405,
                  "void density_tests::heterogeneous_queue_reentrant_put_transaction_samples()");
  }
  local_b0.m_head._0_4_ = 0x2a;
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  start_reentrant_push<int>
            (&local_e0,
             (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
             &local_c8,(int *)&local_b0);
  local_f8.m_queue = local_e0.m_queue;
  local_f8.m_put_data.m_control_block = local_e0.m_put_data.m_control_block;
  local_f8.m_put_data.m_user_storage = local_e0.m_put_data.m_user_storage;
  local_e0.m_queue =
       (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)0x0;
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  reentrant_put_transaction<int>::~reentrant_put_transaction(&local_e0);
  if (local_f8.m_queue ==
      (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)0x0) {
    __assert_fail("!put.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                  ,0x409,
                  "void density_tests::heterogeneous_queue_reentrant_put_transaction_samples()");
  }
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  reentrant_put_transaction<int>::cancel((reentrant_put_transaction<int> *)&local_f8);
  bVar1 = density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
          ::empty((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                   *)&local_c8);
  if ((!bVar1) ||
     (local_f8.m_queue !=
      (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)0x0)) {
    __assert_fail("queue.empty() && put.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                  ,0x40b,
                  "void density_tests::heterogeneous_queue_reentrant_put_transaction_samples()");
  }
  local_b0.m_head = (ControlBlock *)CONCAT44(local_b0.m_head._4_4_,0x2a);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  start_reentrant_push<int>
            (&local_e0,
             (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
             &local_c8,(int *)&local_b0);
  density::heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::
  reentrant_put_transaction<int>::operator=((reentrant_put_transaction<int> *)&local_f8,&local_e0);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  reentrant_put_transaction<int>::~reentrant_put_transaction(&local_e0);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  reentrant_put_transaction<int>::commit((reentrant_put_transaction<int> *)&local_f8);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::cbegin
            (&local_50,
             (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
             &local_c8);
  local_78.m_value.m_pair.m_address = (add_cv_qual_t<void,_(density::cv_qual)1> *)0x0;
  local_78.m_value.m_pair.m_type.m_feature_table = (runtime_type<>)(tuple_type *)0x0;
  local_78.m_control = (ControlBlock *)0x0;
  local_78.m_queue =
       (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)0x0;
  dVar5 = std::
          distance<density::heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::const_iterator>
                    (&local_50,&local_78);
  if (dVar5 != 1) {
    __assert_fail("std::distance(queue.cbegin(), queue.cend()) == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                  ,0x410,
                  "void density_tests::heterogeneous_queue_reentrant_put_transaction_samples()");
  }
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  reentrant_put_transaction<int>::~reentrant_put_transaction
            ((reentrant_put_transaction<int> *)&local_f8);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::destroy
            ((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
             &local_c8);
  local_b0.m_head = (ControlBlock *)0xffef;
  local_b0.m_tail = (ControlBlock *)0xffef;
  local_a0._0_4_ = 0x2a;
  local_c8.m_queue =
       (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
       density::detail::
       FeatureTable<std::tuple<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>,int>
       ::s_table;
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  start_reentrant_dyn_push_copy
            ((reentrant_put_transaction<void> *)&local_e0,&local_b0,(runtime_type<> *)&local_c8,
             &local_a0);
  local_f8.m_queue = local_e0.m_queue;
  local_f8.m_put_data.m_control_block = local_e0.m_put_data.m_control_block;
  local_f8.m_put_data.m_user_storage = local_e0.m_put_data.m_user_storage;
  local_e0.m_queue =
       (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)0x0;
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  reentrant_put_transaction<void>::~reentrant_put_transaction
            ((reentrant_put_transaction<void> *)&local_e0);
  piVar2 = (int *)density::
                  heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
                  reentrant_put_transaction<void>::element_ptr(&local_f8);
  if (*piVar2 == 0x2a) {
    poVar4 = std::operator<<((ostream *)&std::cout,"Putting an ");
    prVar6 = density::
             heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
             reentrant_put_transaction<void>::complete_type(&local_f8);
    ptVar7 = density::runtime_type<>::type_info(prVar6);
    poVar4 = std::operator<<(poVar4,*(char **)(ptVar7 + 8) + (**(char **)(ptVar7 + 8) == '*'));
    poVar4 = std::operator<<(poVar4,"...");
    std::endl<char,std::char_traits<char>>(poVar4);
    local_94 = 1;
    density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
    start_reentrant_push<int>(&local_c8,&local_b0,&local_94);
    local_e0.m_queue = local_c8.m_queue;
    local_e0.m_put_data.m_control_block = local_c8.m_put_data.m_control_block;
    local_e0.m_put_data.m_user_storage = local_c8.m_put_data.m_user_storage;
    local_c8.m_queue =
         (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)0x0;
    density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
    reentrant_put_transaction<int>::~reentrant_put_transaction(&local_c8);
    piVar2 = (int *)density::
                    heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                    ::reentrant_put_transaction<int>::element_ptr(&local_e0);
    if (*piVar2 != 1) {
      __assert_fail("*static_cast<int *>(put_1.element_ptr()) == 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                    ,0x421,
                    "void density_tests::heterogeneous_queue_reentrant_put_transaction_samples()");
    }
    piVar2 = (int *)density::
                    heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                    ::reentrant_put_transaction<int>::element_ptr(&local_e0);
    if (*piVar2 != 1) {
      __assert_fail("put_1.element() == 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                    ,0x422,
                    "void density_tests::heterogeneous_queue_reentrant_put_transaction_samples()");
    }
    density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
    reentrant_put_transaction<int>::~reentrant_put_transaction(&local_e0);
    density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
    reentrant_put_transaction<void>::~reentrant_put_transaction(&local_f8);
    density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
    destroy(&local_b0);
    local_c8.m_queue =
         (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)0xffef;
    local_c8.m_put_data.m_control_block = (ControlBlock *)0xffef;
    local_a0 = (double)CONCAT44(local_a0._4_4_,0x2a);
    local_b0.m_head =
         (ControlBlock *)
         density::detail::
         FeatureTable<std::tuple<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>,int>
         ::s_table;
    density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
    start_reentrant_dyn_push_copy
              ((reentrant_put_transaction<void> *)&local_e0,
               (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
               &local_c8,(runtime_type<> *)&local_b0,&local_a0);
    local_f8.m_queue = local_e0.m_queue;
    local_f8.m_put_data.m_control_block = local_e0.m_put_data.m_control_block;
    local_f8.m_put_data.m_user_storage = local_e0.m_put_data.m_user_storage;
    local_e0.m_queue =
         (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)0x0;
    density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
    reentrant_put_transaction<void>::~reentrant_put_transaction
              ((reentrant_put_transaction<void> *)&local_e0);
    prVar6 = density::
             heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
             reentrant_put_transaction<void>::complete_type(&local_f8);
    if (prVar6->m_feature_table !=
        (tuple_type *)
        density::detail::
        FeatureTable<std::tuple<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>,int>
        ::s_table) {
      __assert_fail("put.complete_type().is<int>()",
                    "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                    ,0x42b,
                    "void density_tests::heterogeneous_queue_reentrant_put_transaction_samples()");
    }
    poVar4 = std::operator<<((ostream *)&std::cout,"Putting an ");
    prVar6 = density::
             heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
             reentrant_put_transaction<void>::complete_type(&local_f8);
    ptVar7 = density::runtime_type<>::type_info(prVar6);
    poVar4 = std::operator<<(poVar4,*(char **)(ptVar7 + 8) + (**(char **)(ptVar7 + 8) == '*'));
    poVar4 = std::operator<<(poVar4,"...");
    std::endl<char,std::char_traits<char>>(poVar4);
    density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
    reentrant_put_transaction<void>::~reentrant_put_transaction(&local_f8);
    density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
    destroy((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
            &local_c8);
    local_f8.m_queue =
         (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)0xffef;
    local_f8.m_put_data.m_control_block = (ControlBlock *)0xffef;
    local_e0.m_queue =
         (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
         CONCAT44(local_e0.m_queue._4_4_,0x2a);
    density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
    start_reentrant_push<int>
              (&local_90,
               (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
               &local_f8,(int *)&local_e0);
    density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
    reentrant_put_transaction<int>::~reentrant_put_transaction(&local_90);
    density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
    destroy((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
            &local_f8);
    local_b0.m_head = (ControlBlock *)0xffef;
    local_b0.m_tail = (ControlBlock *)0xffef;
    local_94 = 0x2a;
    local_c8.m_queue =
         (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
         density::detail::
         FeatureTable<std::tuple<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>,int>
         ::s_table;
    density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
    start_reentrant_dyn_push_copy
              ((reentrant_put_transaction<void> *)&local_e0,&local_b0,(runtime_type<> *)&local_c8,
               &local_94);
    local_f8.m_queue = local_e0.m_queue;
    local_f8.m_put_data.m_control_block = local_e0.m_put_data.m_control_block;
    local_f8.m_put_data.m_user_storage = local_e0.m_put_data.m_user_storage;
    local_e0.m_queue =
         (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)0x0;
    density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
    reentrant_put_transaction<void>::~reentrant_put_transaction
              ((reentrant_put_transaction<void> *)&local_e0);
    local_a0 = 42.0;
    density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
    start_reentrant_push<double>((reentrant_put_transaction<double> *)&local_c8,&local_b0,&local_a0)
    ;
    local_e0.m_queue = local_c8.m_queue;
    local_e0.m_put_data.m_control_block = local_c8.m_put_data.m_control_block;
    local_e0.m_put_data.m_user_storage = local_c8.m_put_data.m_user_storage;
    local_c8.m_queue =
         (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)0x0;
    density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
    reentrant_put_transaction<double>::~reentrant_put_transaction
              ((reentrant_put_transaction<double> *)&local_c8);
    pdVar8 = (double *)
             density::
             heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
             reentrant_put_transaction<double>::element_ptr
                       ((reentrant_put_transaction<double> *)&local_e0);
    if ((*pdVar8 == 42.0) && (!NAN(*pdVar8))) {
      density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
      reentrant_put_transaction<double>::~reentrant_put_transaction
                ((reentrant_put_transaction<double> *)&local_e0);
      density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
      reentrant_put_transaction<void>::~reentrant_put_transaction(&local_f8);
      density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
      destroy(&local_b0);
      return;
    }
    __assert_fail("typed_put.element() == 42.",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                  ,0x445,
                  "void density_tests::heterogeneous_queue_reentrant_put_transaction_samples()");
  }
  __assert_fail("*static_cast<int *>(put.element_ptr()) == 42",
                "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                ,0x419,"void density_tests::heterogeneous_queue_reentrant_put_transaction_samples()"
               );
}

Assistant:

void heterogeneous_queue_reentrant_put_transaction_samples()
    {
        using namespace density;
        {
            //! [heter_queue reentrant_put_transaction default_construct example 1]
            heter_queue<>::reentrant_put_transaction<> transaction;
            assert(transaction.empty());
            //! [heter_queue reentrant_put_transaction default_construct example 1]
        }
        {
            //! [heter_queue reentrant_put_transaction copy_construct example 1]
            static_assert(
              !std::is_copy_constructible<heter_queue<>::reentrant_put_transaction<>>::value, "");
            static_assert(
              !std::is_copy_constructible<heter_queue<int>::reentrant_put_transaction<>>::value,
              "");
            //! [heter_queue reentrant_put_transaction copy_construct example 1]
        }
        {
            //! [heter_queue reentrant_put_transaction copy_assign example 1]
            static_assert(
              !std::is_copy_assignable<heter_queue<>::reentrant_put_transaction<>>::value, "");
            static_assert(
              !std::is_copy_assignable<heter_queue<int>::reentrant_put_transaction<>>::value, "");
            //! [heter_queue reentrant_put_transaction copy_assign example 1]
        }
        {
            //! [heter_queue reentrant_put_transaction move_construct example 1]
            heter_queue<> queue;
            auto          transaction1 = queue.start_reentrant_push(1);

            // move from transaction1 to transaction2
            auto transaction2(std::move(transaction1));
            assert(transaction1.empty());
            assert(transaction2.element() == 1);

            // commit transaction2
            transaction2.commit();
            assert(transaction2.empty());

            //! [heter_queue reentrant_put_transaction move_construct example 1]

            //! [heter_queue reentrant_put_transaction move_construct example 2]
            // reentrant_put_transaction<void> can be move constructed from any reentrant_put_transaction<T>
            static_assert(
              std::is_constructible<
                heter_queue<>::reentrant_put_transaction<void>,
                heter_queue<>::reentrant_put_transaction<void> &&>::value,
              "");
            static_assert(
              std::is_constructible<
                heter_queue<>::reentrant_put_transaction<void>,
                heter_queue<>::reentrant_put_transaction<int> &&>::value,
              "");

            // reentrant_put_transaction<T> can be move constructed only from reentrant_put_transaction<T>
            static_assert(
              !std::is_constructible<
                heter_queue<>::reentrant_put_transaction<int>,
                heter_queue<>::reentrant_put_transaction<void> &&>::value,
              "");
            static_assert(
              !std::is_constructible<
                heter_queue<>::reentrant_put_transaction<int>,
                heter_queue<>::reentrant_put_transaction<float> &&>::value,
              "");
            static_assert(
              std::is_constructible<
                heter_queue<>::reentrant_put_transaction<int>,
                heter_queue<>::reentrant_put_transaction<int> &&>::value,
              "");
            //! [heter_queue reentrant_put_transaction move_construct example 2]
        }
        {
            //! [heter_queue reentrant_put_transaction move_assign example 1]
            heter_queue<> queue;
            auto          transaction1 = queue.start_reentrant_push(1);

            heter_queue<>::reentrant_put_transaction<> transaction2;
            transaction2 = queue.start_reentrant_push(1);
            transaction2 = std::move(transaction1);
            assert(transaction1.empty());
            transaction2.commit();
            assert(transaction2.empty());
            //! [heter_queue reentrant_put_transaction move_assign example 1]

            //! [heter_queue reentrant_put_transaction move_assign example 2]
            // reentrant_put_transaction<void> can be move assigned from any reentrant_put_transaction<T>
            static_assert(
              std::is_assignable<
                heter_queue<>::reentrant_put_transaction<void>,
                heter_queue<>::reentrant_put_transaction<void> &&>::value,
              "");
            static_assert(
              std::is_assignable<
                heter_queue<>::reentrant_put_transaction<void>,
                heter_queue<>::reentrant_put_transaction<int> &&>::value,
              "");

            // reentrant_put_transaction<T> can be move assigned only from reentrant_put_transaction<T>
            static_assert(
              !std::is_assignable<
                heter_queue<>::reentrant_put_transaction<int>,
                heter_queue<>::reentrant_put_transaction<void> &&>::value,
              "");
            static_assert(
              !std::is_assignable<
                heter_queue<>::reentrant_put_transaction<int>,
                heter_queue<>::reentrant_put_transaction<float> &&>::value,
              "");
            static_assert(
              std::is_assignable<
                heter_queue<>::reentrant_put_transaction<int>,
                heter_queue<>::reentrant_put_transaction<int> &&>::value,
              "");
            //! [heter_queue reentrant_put_transaction move_assign example 2]
        }
        {
            //! [heter_queue reentrant_put_transaction raw_allocate example 1]
            heter_queue<> queue;
            struct Msg
            {
                std::chrono::high_resolution_clock::time_point m_time =
                  std::chrono::high_resolution_clock::now();
                size_t m_len  = 0;
                void * m_data = nullptr;
            };

            auto post_message = [&queue](const void * i_data, size_t i_len) {
                auto transaction             = queue.start_reentrant_emplace<Msg>();
                transaction.element().m_len  = i_len;
                transaction.element().m_data = transaction.raw_allocate(i_len, 1);
                memcpy(transaction.element().m_data, i_data, i_len);

                assert(
                  !transaction
                     .empty()); // a put transaction is not empty if it's bound to an element being put
                transaction.commit();
                assert(transaction.empty()); // the commit makes the transaction empty
            };

            auto const start_time = std::chrono::high_resolution_clock::now();

            auto consume_all_msgs = [&queue, &start_time] {
                while (auto consume = queue.try_start_reentrant_consume())
                {
                    auto const checksum =
                      compute_checksum(consume.element<Msg>().m_data, consume.element<Msg>().m_len);
                    std::cout << "Message with checksum " << checksum << " at ";
                    std::cout << (consume.element<Msg>().m_time - start_time).count() << std::endl;
                    consume.commit();
                }
            };

            int msg_1 = 42, msg_2 = 567;
            post_message(&msg_1, sizeof(msg_1));
            post_message(&msg_2, sizeof(msg_2));

            consume_all_msgs();
            //! [heter_queue reentrant_put_transaction raw_allocate example 1]
        }
        {
            heter_queue<> queue;
            //! [heter_queue reentrant_put_transaction raw_allocate_copy example 1]
            struct Msg
            {
                size_t m_len   = 0;
                char * m_chars = nullptr;
            };
            auto post_message = [&queue](const char * i_data, size_t i_len) {
                auto transaction            = queue.start_reentrant_emplace<Msg>();
                transaction.element().m_len = i_len;
                transaction.element().m_chars =
                  transaction.raw_allocate_copy(i_data, i_data + i_len);
                memcpy(transaction.element().m_chars, i_data, i_len);
                transaction.commit();
            };
            //! [heter_queue reentrant_put_transaction raw_allocate_copy example 1]
            (void)post_message;
        }
        {
            heter_queue<> queue;
            //! [heter_queue reentrant_put_transaction raw_allocate_copy example 2]
            struct Msg
            {
                char * m_chars = nullptr;
            };
            auto post_message = [&queue](const std::string & i_string) {
                auto transaction              = queue.start_reentrant_emplace<Msg>();
                transaction.element().m_chars = transaction.raw_allocate_copy(i_string);
                transaction.commit();
            };
            //! [heter_queue reentrant_put_transaction raw_allocate_copy example 2]
            (void)post_message;
        }
        {
            heter_queue<> queue;
            //! [heter_queue reentrant_put_transaction empty example 1]
            heter_queue<>::reentrant_put_transaction<> transaction;
            assert(transaction.empty());

            transaction = queue.start_reentrant_push(1);
            assert(!transaction.empty());
            //! [heter_queue reentrant_put_transaction empty example 1]
        }
        {
            heter_queue<> queue;
            //! [heter_queue reentrant_put_transaction operator_bool example 1]
            heter_queue<>::reentrant_put_transaction<> transaction;
            assert(!transaction);

            transaction = queue.start_reentrant_push(1);
            assert(transaction);
            //! [heter_queue reentrant_put_transaction operator_bool example 1]
        }
        {
            heter_queue<> queue;
            //! [heter_queue reentrant_put_transaction queue example 1]
            heter_queue<>::reentrant_put_transaction<> transaction;
            assert(transaction.queue() == nullptr);

            transaction = queue.start_reentrant_push(1);
            assert(transaction.queue() == &queue);
            //! [heter_queue reentrant_put_transaction queue example 1]
        }
        {
            //! [heter_queue reentrant_put_transaction cancel example 1]
            heter_queue<> queue;

            // start and cancel a put
            assert(queue.empty());
            auto put = queue.start_reentrant_push(42);
            /* assert(queue.empty()); <- this assert would trigger an undefined behavior, because it would access
        the queue during a non-reentrant put transaction. */
            assert(!put.empty());
            put.cancel();
            assert(queue.empty() && put.empty());

            // start and commit a put
            put = queue.start_reentrant_push(42);
            put.commit();
            assert(std::distance(queue.cbegin(), queue.cend()) == 1);
            //! [heter_queue reentrant_put_transaction cancel example 1]
        }
        {
            heter_queue<> queue;
            //! [heter_queue reentrant_put_transaction element_ptr example 1]
            int  value = 42;
            auto put =
              queue.start_reentrant_dyn_push_copy(runtime_type<>::make<decltype(value)>(), &value);
            assert(*static_cast<int *>(put.element_ptr()) == 42);
            std::cout << "Putting an " << put.complete_type().type_info().name() << "..."
                      << std::endl;

            //! [heter_queue reentrant_put_transaction element_ptr example 1]

            //! [heter_queue reentrant_put_transaction element_ptr example 2]
            auto put_1 = queue.start_reentrant_push(1);
            assert(*static_cast<int *>(put_1.element_ptr()) == 1); // this is fine
            assert(put_1.element() == 1);                          // this is better
            //! [heter_queue reentrant_put_transaction element_ptr example 2]
        }
        {
            heter_queue<> queue;
            //! [heter_queue reentrant_put_transaction complete_type example 1]
            int  value = 42;
            auto put =
              queue.start_reentrant_dyn_push_copy(runtime_type<>::make<decltype(value)>(), &value);
            assert(put.complete_type().is<int>());
            std::cout << "Putting an " << put.complete_type().type_info().name() << "..."
                      << std::endl;
            //! [heter_queue reentrant_put_transaction complete_type example 1]
        }
        {
            heter_queue<> queue;
            //! [heter_queue reentrant_put_transaction destroy example 1]
            queue.start_reentrant_push(
              42); /* this transaction is destroyed without being committed,
                            so it gets canceled automatically. */
            //! [heter_queue reentrant_put_transaction destroy example 1]
        }
        {
            heter_queue<> queue;
            //! [heter_queue reentrant_typed_put_transaction element example 1]

            int  value = 42;
            auto untyped_put =
              queue.start_reentrant_dyn_push_copy(runtime_type<>::make<decltype(value)>(), &value);

            auto typed_put = queue.start_reentrant_push(42.);

            /* typed_put = std::move(untyped_put); <- this would not compile: can't assign an untyped
        transaction to a typed transaction */

            assert(typed_put.element() == 42.);

            //! [heter_queue reentrant_typed_put_transaction element example 1]
        }
    }